

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_EncryptFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pEncryptedData,
          CK_ULONG_PTR pulEncryptedDataLen)

{
  CK_ULONG CVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Session *this_00;
  SymmetricAlgorithm *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  uchar *__src;
  CK_RV CVar9;
  ulong uVar10;
  ByteString local_58;
  undefined4 extraout_var_01;
  
  CVar9 = 400;
  if (this->isInitialised == true) {
    this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_00 == (Session *)0x0) {
      CVar9 = 0xb3;
    }
    else if (pulEncryptedDataLen == (CK_ULONG_PTR)0x0) {
      Session::resetOp(this_00);
      CVar9 = 7;
    }
    else {
      iVar3 = Session::getOpType(this_00);
      CVar9 = 0x91;
      if (iVar3 == 2) {
        pSVar5 = Session::getSymmetricCryptoOp(this_00);
        if (pSVar5 == (SymmetricAlgorithm *)0x0) {
          CVar9 = 0x54;
        }
        else {
          pSVar5 = Session::getSymmetricCryptoOp(this_00);
          if ((pSVar5 != (SymmetricAlgorithm *)0x0) &&
             (bVar2 = Session::getAllowMultiPartOp(this_00), bVar2)) {
            iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0x10])(pSVar5);
            iVar4 = (*pSVar5->_vptr_SymmetricAlgorithm[0x11])(pSVar5);
            uVar10 = CONCAT44(extraout_var_00,iVar4) + CONCAT44(extraout_var,iVar3);
            iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0x13])(pSVar5);
            if ((char)iVar3 != '\0') {
              iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0xd])(pSVar5);
              uVar6 = CONCAT44(extraout_var_01,iVar3);
              iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0xf])(pSVar5);
              if (((char)iVar3 == '\0') && (uVar10 % uVar6 != 0)) {
                Session::resetOp(this_00);
                softHSMLog(7,"SymEncryptFinal",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0xaf3,
                           "Remaining buffer size is not an integral of the block size. Block size: %#2x  Remaining size: %#2x"
                           ,uVar6,uVar10);
                return 0x21;
              }
              if ((char)iVar3 != '\0') {
                uVar10 = (uVar6 + uVar10) - (uVar6 + uVar10) % uVar6;
              }
            }
            if (pEncryptedData == (CK_BYTE_PTR)0x0) {
              *pulEncryptedDataLen = uVar10;
              return 0;
            }
            if (*pulEncryptedDataLen < uVar10) {
              softHSMLog(7,"SymEncryptFinal",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0xb05,"output buffer size: %#5x  size: %#5x",*pulEncryptedDataLen,uVar10);
              *pulEncryptedDataLen = uVar10;
              return 0x150;
            }
            ByteString::ByteString(&local_58);
            iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[4])(pSVar5,&local_58);
            if ((char)iVar3 == '\0') {
              CVar9 = 5;
              Session::resetOp(this_00);
            }
            else {
              CVar1 = *pulEncryptedDataLen;
              sVar7 = ByteString::size(&local_58);
              softHSMLog(7,"SymEncryptFinal",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0xb12,"output buffer size: %#2x  size: %#2x  encryptedFinal.size(): %#2x",
                         CVar1,uVar10,sVar7);
              uVar10 = *pulEncryptedDataLen;
              sVar8 = ByteString::size(&local_58);
              if (uVar10 < sVar8) {
                Session::resetOp(this_00);
                CVar1 = *pulEncryptedDataLen;
                sVar8 = ByteString::size(&local_58);
                CVar9 = 5;
                softHSMLog(3,"SymEncryptFinal",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0xb19,
                           "EncryptFinal returning too much data. Length of output data buffer is %i but %i bytes was returned by the encrypt."
                           ,CVar1,sVar8,sVar7);
              }
              else {
                sVar7 = ByteString::size(&local_58);
                if (sVar7 != 0) {
                  __src = ByteString::byte_str(&local_58);
                  sVar7 = ByteString::size(&local_58);
                  memcpy(pEncryptedData,__src,sVar7);
                }
                sVar7 = ByteString::size(&local_58);
                *pulEncryptedDataLen = sVar7;
                Session::resetOp(this_00);
                CVar9 = 0;
              }
            }
            local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_58.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
            return CVar9;
          }
          Session::resetOp(this_00);
        }
      }
    }
  }
  return CVar9;
}

Assistant:

CK_RV SoftHSM::C_EncryptFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pEncryptedData, CK_ULONG_PTR pulEncryptedDataLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Github issue #469, check NULL_PTR on pulEncryptedDataLen
	if (pulEncryptedDataLen == NULL)
	{
		session->resetOp();
		return CKR_ARGUMENTS_BAD;
	}

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_ENCRYPT) return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getSymmetricCryptoOp() != NULL)
		return SymEncryptFinal(session, pEncryptedData, pulEncryptedDataLen);
	else
		return CKR_FUNCTION_NOT_SUPPORTED;
}